

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

void __thiscall
ylt::metric::dynamic_metric_manager<test_id_t<1UL>_>::dynamic_metric_manager
          (dynamic_metric_manager<test_id_t<1UL>_> *this)

{
  rep rVar1;
  shared_ptr<coro_io::io_context_pool> *in_RDI;
  map_sharded_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>,_ylt::metric::dynamic_metric_manager<test_id_t<1UL>_>::my_hash<131UL>_>
  *unaff_retaddr;
  dynamic_metric_manager<test_id_t<1UL>_> *in_stack_00000070;
  shared_ptr<coro_io::io_context_pool> *psVar2;
  uint local_10;
  uint local_c;
  
  psVar2 = in_RDI;
  local_c = std::thread::hardware_concurrency();
  local_10 = 0x80;
  std::min<unsigned_int>(&local_c,&local_10);
  util::
  map_sharded_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>,_ylt::metric::dynamic_metric_manager<test_id_t<1UL>_>::my_hash<131UL>_>
  ::map_sharded_t(unaff_retaddr,(size_t)psVar2);
  psVar2 = in_RDI + 2;
  std::shared_ptr<coro_io::period_timer>::shared_ptr
            ((shared_ptr<coro_io::period_timer> *)in_RDI,psVar2);
  std::shared_ptr<coro_io::io_context_pool>::shared_ptr(in_RDI,psVar2);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                    ((duration<long,_std::ratio<1L,_1L>_> *)&ylt_label_max_age);
  if (0 < rVar1) {
    clean_label_expired(in_stack_00000070);
  }
  return;
}

Assistant:

dynamic_metric_manager()
      : metric_map_(
            std::min<unsigned>(std::thread::hardware_concurrency(), 128u)) {
    if (ylt_label_max_age.count() > 0) {
      clean_label_expired();
    }
  }